

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O0

void __thiscall Iex_3_4::BaseExc::BaseExc(BaseExc *this,BaseExc *be)

{
  long in_RSI;
  exception *in_RDI;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__BaseExc_00188610;
  std::__cxx11::string::string((string *)(in_RDI + 8),(string *)(in_RSI + 8));
  std::__cxx11::string::string((string *)(in_RDI + 0x28),(string *)(in_RSI + 0x28));
  return;
}

Assistant:

BaseExc::BaseExc (const BaseExc& be)
    : _message (be._message), _stackTrace (be._stackTrace)
{}